

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_bvs_16(void)

{
  uint offset_00;
  uint offset;
  
  if ((m68ki_cpu.v_flag & 0x80) == 0) {
    m68ki_cpu.pc = m68ki_cpu.pc + 2;
    m68ki_remaining_cycles = m68ki_remaining_cycles - m68ki_cpu.cyc_bcc_notake_w;
  }
  else {
    offset_00 = m68ki_read_imm_16();
    m68ki_cpu.pc = m68ki_cpu.pc - 2;
    m68ki_branch_16(offset_00);
  }
  return;
}

Assistant:

static void m68k_op_bvs_16(void)
{
	if(COND_VS())
	{
		uint offset = OPER_I_16();
		REG_PC -= 2;
		m68ki_trace_t0();			   /* auto-disable (see m68kcpu.h) */
		m68ki_branch_16(offset);
		return;
	}
	REG_PC += 2;
	USE_CYCLES(CYC_BCC_NOTAKE_W);
}